

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:360:60)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:360:60)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  long *plVar1;
  object *this_00;
  undefined8 *puVar2;
  pointer pvVar3;
  anon_class_16_1_570cf4e1_for_f *this_01;
  object_ptr props;
  object_ptr o;
  vector<mjs::string,_std::allocator<mjs::string>_> local_80;
  _Any_data local_68;
  value local_58;
  
  this_01 = &this->f;
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)&o,v);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  pvVar3 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pvVar3) / 0x28) < 2) {
    pvVar3 = (pointer)&value::undefined;
  }
  else {
    pvVar3 = pvVar3 + 1;
  }
  (**(code **)(*plVar1 + 0x88))(&props,plVar1,pvVar3);
  this_00 = (object *)gc_heap_ptr_untyped::get(&props.super_gc_heap_ptr_untyped);
  object::own_property_names(&local_80,this_00,false);
  for (; local_80.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_80.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
         super__Vector_impl_data._M_finish;
      local_80.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_80.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&props.super_gc_heap_ptr_untyped);
    local_68 = (_Any_data)
               string::view(local_80.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    (**(code **)*puVar2)(&local_58,puVar2,&local_68);
    anon_unknown_33::define_own_property_checked
              (&this_01->global,&o,
               local_80.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_start,&local_58);
    value::~value(&local_58);
  }
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_80);
  value::value(__return_storage_ptr__,&o);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&props.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }